

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::api::anon_unknown_1::GraphicsPipeline::create
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *param_3)

{
  Deleter<vk::Handle<(vk::HandleType)18>_> deleter;
  reference this;
  Move<vk::Handle<(vk::HandleType)18>_> *this_00;
  Deleter<vk::Handle<(vk::HandleType)18>_> local_a8;
  deUint64 local_90;
  Handle<(vk::HandleType)18> local_88;
  Parameters local_79;
  undefined1 local_78 [8];
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  VkResult result;
  allocator<vk::Handle<(vk::HandleType)18>_> local_49;
  Handle<(vk::HandleType)18> local_48;
  undefined1 local_40 [8];
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> handles;
  Parameters *param_2_local;
  Resources *res_local;
  Environment *env_local;
  
  handles.
  super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)param_3;
  ::vk::Handle<(vk::HandleType)18>::Handle(&local_48,0);
  std::allocator<vk::Handle<(vk::HandleType)18>_>::allocator(&local_49);
  std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> *
         )local_40,1,&local_48,&local_49);
  std::allocator<vk::Handle<(vk::HandleType)18>_>::~allocator(&local_49);
  scopedHandles.
  super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = VK_NOT_READY;
  Parameters::Parameters(&local_79);
  createMultiple((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                  *)local_78,env,res,&local_79,
                 (vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                  *)local_40,
                 (VkResult *)
                 &scopedHandles.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::checkResult((VkResult)
                    scopedHandles.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"result",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
                    ,0x6c5);
  this = std::
         vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
         ::front((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                  *)local_78);
  this_00 = de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>::operator->(this);
  local_90 = (deUint64)::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::disown(this_00);
  local_88.m_internal =
       (deUint64)
       ::vk::refdetails::check<vk::Handle<(vk::HandleType)18>>((Handle<(vk::HandleType)18>)local_90)
  ;
  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::Deleter
            (&local_a8,env->vkd,env->device,env->allocationCallbacks);
  deleter.m_device = local_a8.m_device;
  deleter.m_deviceIface = local_a8.m_deviceIface;
  deleter.m_allocator = local_a8.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>::Move<vk::Handle<(vk::HandleType)18>>
            ((Move<vk::Handle<(vk::HandleType)18>> *)__return_storage_ptr__,
             (Checked<vk::Handle<(vk::HandleType)18>_>)local_88.m_internal,deleter);
  std::
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *)local_78);
  std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
           *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkPipeline> create (const Environment& env, const Resources& res, const Parameters&)
	{
		vector<VkPipeline>		handles			(1, DE_NULL);
		VkResult				result			= VK_NOT_READY;
		vector<VkPipelineSp>	scopedHandles	= createMultiple(env, res, Parameters(), &handles, &result);

		VK_CHECK(result);
		return Move<VkPipeline>(check<VkPipeline>(scopedHandles.front()->disown()), Deleter<VkPipeline>(env.vkd, env.device, env.allocationCallbacks));
	}